

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::SetIndividualRewardModel
          (TOIFactoredRewardDecPOMDPDiscrete *this,RewardModel *rewardModel,Index agentID)

{
  size_type sVar1;
  reference ppRVar2;
  uint in_EDX;
  value_type in_RSI;
  size_type in_RDI;
  vector<RewardModel_*,_std::allocator<RewardModel_*>_> *unaff_retaddr;
  size_type __new_size;
  
  __new_size = in_RDI;
  sVar1 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::size
                    ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RDI + 0x2c0));
  if (sVar1 <= in_EDX) {
    std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::resize(unaff_retaddr,__new_size);
  }
  ppRVar2 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::operator[]
                      ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)(in_RDI + 0x2c0),
                       (ulong)in_EDX);
  *ppRVar2 = in_RSI;
  return;
}

Assistant:

void TOIFactoredRewardDecPOMDPDiscrete::
SetIndividualRewardModel(RewardModel* rewardModel,
                         Index agentID)
{
    if(_m_p_rModels.size()<=agentID)
        _m_p_rModels.resize(agentID+1);

    _m_p_rModels[agentID]=rewardModel;
}